

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cpp
# Opt level: O2

int32_t trun::to_int32(char *str)

{
  int iVar1;
  allocator<char> local_29;
  string local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,str,&local_29);
  iVar1 = std::__cxx11::stoi(&local_28,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&local_28);
  return iVar1;
}

Assistant:

int32_t to_int32(const char *str) {
        return std::stoi(str);
    }